

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

void __thiscall logger::OutputWorker::Write(OutputWorker *this,LogStringBuffer *buffer)

{
  size_t *psVar1;
  int iVar2;
  _Node *p_Var3;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::stringbuf::str();
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->QueueLock);
  if (iVar2 == 0) {
    if ((this->QueuePublic).
        super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
        ._M_impl._M_node._M_size < 0x400) {
      p_Var3 = std::__cxx11::
               list<logger::OutputWorker::QueuedMessage,std::allocator<logger::OutputWorker::QueuedMessage>>
               ::_M_create_node<logger::Level&,char_const*&,std::__cxx11::string&>
                         ((list<logger::OutputWorker::QueuedMessage,std::allocator<logger::OutputWorker::QueuedMessage>>
                           *)&this->QueuePublic,&buffer->LogLevel,&buffer->ChannelName,&local_40);
      std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
      psVar1 = &(this->QueuePublic).
                super__List_base<logger::OutputWorker::QueuedMessage,_std::allocator<logger::OutputWorker::QueuedMessage>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      LOCK();
      (this->Overrun).super___atomic_base<int>._M_i =
           (this->Overrun).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->QueueLock);
    std::condition_variable::notify_all();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void OutputWorker::Write(LogStringBuffer& buffer)
{
    std::string str = buffer.LogStream.str();

#if defined(_WIN32)
    // If a debugger is present:
    if (CachedIsDebuggerPresent)
    {
        // Log all messages immediately to the Visual Studio Output Window
        // to allow logging while single-stepping in a debugger.
        ::OutputDebugStringA((str + "\n").c_str());
    }
#endif // _WIN32

#if defined(LOGGER_NEVER_DROP)
    for (;; Flush())
    {
        std::lock_guard<std::mutex> locker(QueueLock);

        if (QueuePublic.size() >= kWorkQueueLimit)
        {
            continue;
        }
        else
        {
            QueuePublic.emplace_back(buffer.LogLevel, buffer.ChannelName, str);
            break;
        }
    }
#else // LOGGER_NEVER_DROP
    {
        std::lock_guard<std::mutex> locker(QueueLock);

        if (QueuePublic.size() >= kWorkQueueLimit)
            Overrun++;
        else
            QueuePublic.emplace_back(buffer.LogLevel, buffer.ChannelName, str);
    }
#endif // LOGGER_NEVER_DROP

    QueueCondition.notify_all();
}